

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSLSocket.cpp
# Opt level: O2

bool __thiscall blc::network::SSLSocket::writable(SSLSocket *this)

{
  bool bVar1;
  uint __i;
  int iVar2;
  long lVar3;
  timeval timeout;
  fd_set fds;
  
  timeout.tv_sec = 0;
  timeout.tv_usec = 0;
  if (this->_opened == false) {
    bVar1 = false;
  }
  else {
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      fds.fds_bits[lVar3] = 0;
    }
    iVar2 = *(int *)&(this->super_Socket).field_0x44;
    fds.fds_bits[iVar2 / 0x40] = fds.fds_bits[iVar2 / 0x40] | 1L << ((byte)iVar2 & 0x3f);
    iVar2 = select(iVar2 + 1,(fd_set *)0x0,(fd_set *)&fds,(fd_set *)0x0,(timeval *)&timeout);
    bVar1 = 0 < iVar2;
  }
  return bVar1;
}

Assistant:

bool blc::network::SSLSocket::writable() const {
	fd_set fds;
	struct timeval timeout = {0, 0};

	if (this->_opened == false)
		return (false);
	FD_ZERO(&fds);
	FD_SET(this->_socket, &fds);
	if (select(this->_socket + 1, 0, &fds, 0, &timeout) <= 0)
		return (false);
	return (true);
}